

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasHeat2D_kry.c
# Opt level: O3

void PrintOutput(void *mem,sunrealtype t,N_Vector uu)

{
  uint uVar1;
  int kused;
  undefined8 local_60;
  sunrealtype local_58;
  long nps;
  long npe;
  long nreLS;
  long nre;
  long nje;
  long nni;
  long nst;
  sunrealtype hused;
  long nli;
  
  local_58 = t;
  local_60 = N_VMaxNorm(uu);
  uVar1 = IDAGetLastOrder(mem,&kused);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","IDAGetLastOrder",
            (ulong)uVar1);
  }
  uVar1 = IDAGetNumSteps(mem,&nst);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","IDAGetNumSteps",
            (ulong)uVar1);
  }
  uVar1 = IDAGetNumNonlinSolvIters(mem,&nni);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","IDAGetNumNonlinSolvIters",
            (ulong)uVar1);
  }
  uVar1 = IDAGetNumResEvals(mem,&nre);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","IDAGetNumResEvals",
            (ulong)uVar1);
  }
  uVar1 = IDAGetLastStep(mem,&hused);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","IDAGetLastStep",
            (ulong)uVar1);
  }
  uVar1 = IDAGetNumJtimesEvals(mem,&nje);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","IDAGetNumJtimesEvals",
            (ulong)uVar1);
  }
  uVar1 = IDAGetNumLinIters(mem,&nli);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","IDAGetNumLinIters",
            (ulong)uVar1);
  }
  uVar1 = IDAGetNumLinResEvals(mem,&nreLS);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","IDAGetNumLinResEvals",
            (ulong)uVar1);
  }
  uVar1 = IDAGetNumPrecEvals(mem,&npe);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","IDAGetPrecEvals",
            (ulong)uVar1);
  }
  uVar1 = IDAGetNumPrecSolves(mem,&nps);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","IDAGetNumPrecSolves",
            (ulong)uVar1);
  }
  printf(" %5.2f %13.5e  %d  %3ld  %3ld  %3ld  %4ld  %4ld  %9.2e  %3ld %3ld\n",local_58,local_60,
         hused,(ulong)(uint)kused,nst,nni,nje,nre,nreLS,npe,nps);
  return;
}

Assistant:

static void PrintOutput(void* mem, sunrealtype t, N_Vector uu)
{
  sunrealtype hused, umax;
  long int nst, nni, nje, nre, nreLS, nli, npe, nps;
  int kused, retval;

  umax = N_VMaxNorm(uu);

  retval = IDAGetLastOrder(mem, &kused);
  check_retval(&retval, "IDAGetLastOrder", 1);
  retval = IDAGetNumSteps(mem, &nst);
  check_retval(&retval, "IDAGetNumSteps", 1);
  retval = IDAGetNumNonlinSolvIters(mem, &nni);
  check_retval(&retval, "IDAGetNumNonlinSolvIters", 1);
  retval = IDAGetNumResEvals(mem, &nre);
  check_retval(&retval, "IDAGetNumResEvals", 1);
  retval = IDAGetLastStep(mem, &hused);
  check_retval(&retval, "IDAGetLastStep", 1);
  retval = IDAGetNumJtimesEvals(mem, &nje);
  check_retval(&retval, "IDAGetNumJtimesEvals", 1);
  retval = IDAGetNumLinIters(mem, &nli);
  check_retval(&retval, "IDAGetNumLinIters", 1);
  retval = IDAGetNumLinResEvals(mem, &nreLS);
  check_retval(&retval, "IDAGetNumLinResEvals", 1);
  retval = IDAGetNumPrecEvals(mem, &npe);
  check_retval(&retval, "IDAGetPrecEvals", 1);
  retval = IDAGetNumPrecSolves(mem, &nps);
  check_retval(&retval, "IDAGetNumPrecSolves", 1);

#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf(" %5.2Lf %13.5Le  %d  %3ld  %3ld  %3ld  %4ld  %4ld  %9.2Le  %3ld "
         "%3ld\n",
         t, umax, kused, nst, nni, nje, nre, nreLS, hused, npe, nps);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf(" %5.2f %13.5e  %d  %3ld  %3ld  %3ld  %4ld  %4ld  %9.2e  %3ld %3ld\n",
         t, umax, kused, nst, nni, nje, nre, nreLS, hused, npe, nps);
#else
  printf(" %5.2f %13.5e  %d  %3ld  %3ld  %3ld  %4ld  %4ld  %9.2e  %3ld %3ld\n",
         t, umax, kused, nst, nni, nje, nre, nreLS, hused, npe, nps);
#endif
}